

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Jupiter::Socket::Data::Data(Data *this,size_t buffer_size)

{
  Buffer::Buffer(&this->buffer);
  this->rawSock = -1;
  this->remote_port = 0;
  this->bound_port = 0;
  (this->remote_host)._M_dataplus._M_p = (pointer)&(this->remote_host).field_2;
  (this->remote_host)._M_string_length = 0;
  (this->remote_host).field_2._M_local_buf[0] = '\0';
  (this->bound_host)._M_dataplus._M_p = (pointer)&(this->bound_host).field_2;
  (this->bound_host)._M_string_length = 0;
  (this->bound_host).field_2._M_local_buf[0] = '\0';
  this->sockType = 3;
  this->sockProto = 0xff;
  this->is_shutdown = false;
  Buffer::reserve(&this->buffer,buffer_size);
  return;
}

Assistant:

Jupiter::Socket::Data::Data(size_t buffer_size) {
	Jupiter::Socket::Data::buffer.reserve(buffer_size);
}